

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeSourceMapProlog(WasmBinaryWriter *this)

{
  pointer pCVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  size_t in_RCX;
  void *__buf;
  Module *pMVar5;
  char *pcVar6;
  anon_class_8_1_8991fb9c aVar7;
  pointer __lhs;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  anon_class_8_1_8991fb9c local_38;
  anon_class_8_1_8991fb9c writeOptionalString;
  anon_class_8_1_8991fb9c writeStringVector;
  
  std::operator<<(this->sourceMap,"{\"version\":3,");
  __lhs = (this->wasm->customSections).
          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
          super__Vector_impl_data._M_start;
  pCVar1 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pCVar1) goto LAB_00cbc3b3;
    bVar3 = std::operator==(&__lhs->name,BinaryConsts::CustomSections::BuildId);
    if (bVar3) break;
    __lhs = __lhs + 1;
  }
  local_58._8_8_ = &local_38;
  local_38.this = (WasmBinaryWriter *)0x0;
  local_40 = std::
             _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)__lhs;
  LEB<unsigned_int,_unsigned_char>::read
            ((LEB<unsigned_int,_unsigned_char> *)&writeOptionalString,(int)&local_58,__buf,in_RCX);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if ((__lhs->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish +
      -(long)(__lhs->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start ==
      (pointer)((long)&((local_38.this)->tableOfContents).functionBodies.
                       super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start +
               ((ulong)writeOptionalString.this & 0xffffffff))) {
    std::operator<<(this->sourceMap,"\"debugId\":\"");
    for (aVar7.this = local_38.this; poVar4 = this->sourceMap,
        aVar7.this <
        (WasmBinaryWriter *)
        ((__lhs->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish +
        -(long)(__lhs->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
        aVar7.this = (WasmBinaryWriter *)
                     ((long)&((aVar7.this)->tableOfContents).functionBodies.
                             super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1)) {
      poVar4 = std::operator<<(poVar4,0x30);
      lVar2 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<
                (poVar4,(uint)(byte)(__lhs->data).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(long)&((aVar7.this)->tableOfContents).functionBodies.
                                            super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                                            ._M_impl.super__Vector_impl_data]);
    }
    pcVar6 = "\",";
  }
  else {
    poVar4 = (ostream *)&std::cerr;
    pcVar6 = "warning: build id section with an incorrect size detected!\n";
  }
  std::operator<<(poVar4,pcVar6);
LAB_00cbc3b3:
  local_38.this = this;
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&local_38,"file",&this->wasm->debugInfoFile);
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&local_38,"sourceRoot",&this->wasm->debugInfoSourceRoot);
  writeOptionalString.this = this;
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&writeOptionalString,"sources",&this->wasm->debugInfoFileNames);
  pMVar5 = this->wasm;
  if ((pMVar5->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pMVar5->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
              (&writeOptionalString,"sourcesContent",&pMVar5->debugInfoSourcesContent);
    pMVar5 = this->wasm;
  }
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&writeOptionalString,"names",&pMVar5->debugInfoSymbolNames);
  std::operator<<(this->sourceMap,"\"mappings\":\"");
  return;
}

Assistant:

void WasmBinaryWriter::writeSourceMapProlog() {
  *sourceMap << "{\"version\":3,";

  for (const auto& section : wasm->customSections) {
    if (section.name == BinaryConsts::CustomSections::BuildId) {
      U32LEB ret;
      size_t pos = 0;
      ret.read([&]() { return section.data[pos++]; });

      if (section.data.size() != pos + ret.value) {
        std::cerr
          << "warning: build id section with an incorrect size detected!\n";
        break;
      }

      *sourceMap << "\"debugId\":\"";
      for (size_t i = pos; i < section.data.size(); i++) {
        *sourceMap << std::setfill('0') << std::setw(2) << std::hex
                   << static_cast<int>(static_cast<uint8_t>(section.data[i]));
      }
      *sourceMap << "\",";
      break;
    }
  }

  auto writeOptionalString = [&](const char* name, const std::string& str) {
    if (!str.empty()) {
      *sourceMap << "\"" << name << "\":\"" << str << "\",";
    }
  };

  writeOptionalString("file", wasm->debugInfoFile);
  writeOptionalString("sourceRoot", wasm->debugInfoSourceRoot);

  auto writeStringVector = [&](const char* name,
                               const std::vector<std::string>& vec) {
    *sourceMap << "\"" << name << "\":[";
    for (size_t i = 0; i < vec.size(); i++) {
      if (i > 0) {
        *sourceMap << ",";
      }
      *sourceMap << "\"" << vec[i] << "\"";
    }
    *sourceMap << "],";
  };

  writeStringVector("sources", wasm->debugInfoFileNames);

  if (!wasm->debugInfoSourcesContent.empty()) {
    writeStringVector("sourcesContent", wasm->debugInfoSourcesContent);
  }

  // TODO: This field is optional; maybe we should omit if it's empty.
  // TODO: Binaryen actually does not correctly preserve symbol names when it
  // rewrites the mappings. We should maybe just drop them, or else handle
  // them correctly.
  writeStringVector("names", wasm->debugInfoSymbolNames);

  *sourceMap << "\"mappings\":\"";
}